

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

uint64_t rapidjson::internal::BigInteger::MulAdd64
                   (uint64_t a,uint64_t b,uint64_t k,uint64_t *outHigh)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 local_78;
  uint64_t hi;
  uint64_t lo;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t x0;
  uint64_t b1;
  uint64_t b0;
  uint64_t a1;
  uint64_t a0;
  uint64_t *outHigh_local;
  uint64_t k_local;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar1 = (a & 0xffffffff) * (b & 0xffffffff);
  uVar2 = (a >> 0x20) * (b & 0xffffffff);
  lo = (a >> 0x20) * (b >> 0x20);
  uVar3 = uVar2 + (uVar1 >> 0x20) + (a & 0xffffffff) * (b >> 0x20);
  if (uVar3 < uVar2) {
    lo = lo + 0x100000000;
  }
  local_78 = lo + (uVar3 >> 0x20);
  uVar1 = k + (uVar3 << 0x20) + (uVar1 & 0xffffffff);
  if (uVar1 < k) {
    local_78 = local_78 + 1;
  }
  *outHigh = local_78;
  return uVar1;
}

Assistant:

static uint64_t MulAdd64(uint64_t a, uint64_t b, uint64_t k, uint64_t* outHigh) {
#if defined(_MSC_VER) && defined(_M_AMD64)
        uint64_t low = _umul128(a, b, outHigh) + k;
        if (low < k)
            (*outHigh)++;
        return low;
#elif (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 6)) && defined(__x86_64__)
        __extension__ typedef unsigned __int128 uint128;
        uint128 p = static_cast<uint128>(a) * static_cast<uint128>(b);
        p += k;
        *outHigh = static_cast<uint64_t>(p >> 64);
        return static_cast<uint64_t>(p);
#else
        const uint64_t a0 = a & 0xFFFFFFFF, a1 = a >> 32, b0 = b & 0xFFFFFFFF, b1 = b >> 32;
        uint64_t x0 = a0 * b0, x1 = a0 * b1, x2 = a1 * b0, x3 = a1 * b1;
        x1 += (x0 >> 32); // can't give carry
        x1 += x2;
        if (x1 < x2)
            x3 += (static_cast<uint64_t>(1) << 32);
        uint64_t lo = (x1 << 32) + (x0 & 0xFFFFFFFF);
        uint64_t hi = x3 + (x1 >> 32);

        lo += k;
        if (lo < k)
            hi++;
        *outHigh = hi;
        return lo;
#endif
    }